

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetPATIndex
          (GmmXe_LPGCachePolicy *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage,
          bool *pCompressionEnable,bool IsCpuCacheable)

{
  Context *pCVar1;
  uint uVar2;
  
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])(pResInfo);
  }
  pCVar1 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  if (IsCpuCacheable) {
    uVar2 = (uint)(pCVar1->CachePolicy[Usage].field_1.Value >> 0x24) & 0x3f;
  }
  else {
    uVar2 = pCVar1->CachePolicy[Usage].field_3.PATIndex;
  }
  return uVar2;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetPATIndex(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage, bool *pCompressionEnable, bool IsCpuCacheable)
{
    __GMM_ASSERT(pGmmLibContext->GetCachePolicyElement(Usage).Initialized);
    GMM_UNREFERENCED_PARAMETER(pCompressionEnable);

    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if(pResInfo &&
       pResInfo->GetResFlags().Info.XAdapter &&
       Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE)
    {
        __GMM_ASSERT(false);
    }

    if(IsCpuCacheable)
    {
        return (uint32_t)(GET_COHERENT_PATINDEX_VALUE(pGmmLibContext, Usage));
    }
    else
    {
        return pGmmLibContext->GetCachePolicyElement(Usage).PATIndex;
    }
}